

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O1

ON_Color __thiscall ON_SectionStyle::HatchColor(ON_SectionStyle *this,bool print)

{
  ON_Color *pOVar1;
  undefined3 in_register_00000031;
  
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar1 = &ON_Color::UnsetColor;
  }
  else {
    pOVar1 = &this->m_private->m_hatch_color + CONCAT31(in_register_00000031,print);
  }
  return (ON_Color)pOVar1->field_0;
}

Assistant:

ON_Color ON_SectionStyle::HatchColor(bool print) const
{
  if (m_private)
    return print ? m_private->m_hatch_print_color : m_private->m_hatch_color;
  return ON_Color::UnsetColor;
}